

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void ssl_tls_trace(int direction,int ssl_ver,int content_type,void *buf,size_t len,SSL *ssl,
                  void *userp)

{
  char cVar1;
  Curl_easy *data_00;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  curl_infotype type;
  connectdata *conn;
  char *verstr;
  int txt_len;
  int msg_type;
  char unknown [32];
  char ssl_buf [1024];
  char *tls_rt_name;
  char *msg_name;
  Curl_easy *data;
  SSL *ssl_local;
  size_t len_local;
  void *buf_local;
  int content_type_local;
  int ssl_ver_local;
  int direction_local;
  
  conn = (connectdata *)0x0;
  if ((((userp != (void *)0x0) && (*userp != 0)) && (*(long *)(*userp + 0x2c0) != 0)) &&
     ((direction == 0 || (direction == 1)))) {
    data_00 = *userp;
    if (ssl_ver != 0) {
      if (ssl_ver == 2) {
        conn = (connectdata *)anon_var_dwarf_ea137;
      }
      else if (ssl_ver == 0x300) {
        conn = (connectdata *)anon_var_dwarf_ea14e;
      }
      else if (ssl_ver == 0x301) {
        conn = (connectdata *)anon_var_dwarf_ea159;
      }
      else if (ssl_ver == 0x302) {
        conn = (connectdata *)anon_var_dwarf_ea164;
      }
      else if (ssl_ver == 0x303) {
        conn = (connectdata *)anon_var_dwarf_ea16f;
      }
      else if (ssl_ver == 0x304) {
        conn = (connectdata *)anon_var_dwarf_ea17a;
      }
      else {
        curl_msnprintf((char *)&txt_len,0x20,"(%x)",(ulong)(uint)ssl_ver);
        conn = (connectdata *)&txt_len;
      }
    }
    if (ssl_ver != 0) {
      if ((ssl_ver >> 8 == 3) && (content_type != 0)) {
        ssl_buf._1016_8_ = tls_rt_type(content_type);
      }
      else {
        ssl_buf._1016_8_ = (long)"user=%s\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01" + 0x29;
      }
      cVar1 = *buf;
      pcVar4 = ssl_msg_type(ssl_ver >> 8,(int)cVar1);
      pcVar2 = "PLAIN";
      if (direction != 0) {
        pcVar2 = "LOGOUT";
      }
      iVar3 = curl_msnprintf(unknown + 0x18,0x400,"%s (%s), %s, %s (%d):\n",conn,pcVar2 + 3,
                             ssl_buf._1016_8_,pcVar4,(int)cVar1);
      Curl_debug(data_00,CURLINFO_TEXT,unknown + 0x18,(long)iVar3,(connectdata *)0x0);
    }
    type = CURLINFO_SSL_DATA_IN;
    if (direction == 1) {
      type = CURLINFO_SSL_DATA_OUT;
    }
    Curl_debug(data_00,type,(char *)buf,len,(connectdata *)0x0);
  }
  return;
}

Assistant:

static void ssl_tls_trace(int direction, int ssl_ver, int content_type,
                          const void *buf, size_t len, SSL *ssl,
                          void *userp)
{
  struct Curl_easy *data;
  const char *msg_name, *tls_rt_name;
  char ssl_buf[1024];
  char unknown[32];
  int msg_type, txt_len;
  const char *verstr = NULL;
  struct connectdata *conn = userp;

  if(!conn || !conn->data || !conn->data->set.fdebug ||
     (direction != 0 && direction != 1))
    return;

  data = conn->data;

  switch(ssl_ver) {
#ifdef SSL2_VERSION /* removed in recent versions */
  case SSL2_VERSION:
    verstr = "SSLv2";
    break;
#endif
#ifdef SSL3_VERSION
  case SSL3_VERSION:
    verstr = "SSLv3";
    break;
#endif
  case TLS1_VERSION:
    verstr = "TLSv1.0";
    break;
#ifdef TLS1_1_VERSION
  case TLS1_1_VERSION:
    verstr = "TLSv1.1";
    break;
#endif
#ifdef TLS1_2_VERSION
  case TLS1_2_VERSION:
    verstr = "TLSv1.2";
    break;
#endif
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    verstr = "TLSv1.3";
    break;
#endif
  case 0:
    break;
  default:
    snprintf(unknown, sizeof(unknown), "(%x)", ssl_ver);
    verstr = unknown;
    break;
  }

  if(ssl_ver) {
    /* the info given when the version is zero is not that useful for us */

    ssl_ver >>= 8; /* check the upper 8 bits only below */

    /* SSLv2 doesn't seem to have TLS record-type headers, so OpenSSL
     * always pass-up content-type as 0. But the interesting message-type
     * is at 'buf[0]'.
     */
    if(ssl_ver == SSL3_VERSION_MAJOR && content_type)
      tls_rt_name = tls_rt_type(content_type);
    else
      tls_rt_name = "";

    msg_type = *(char *)buf;
    msg_name = ssl_msg_type(ssl_ver, msg_type);

    txt_len = snprintf(ssl_buf, sizeof(ssl_buf), "%s (%s), %s, %s (%d):\n",
                       verstr, direction?"OUT":"IN",
                       tls_rt_name, msg_name, msg_type);
    Curl_debug(data, CURLINFO_TEXT, ssl_buf, (size_t)txt_len, NULL);
  }

  Curl_debug(data, (direction == 1) ? CURLINFO_SSL_DATA_OUT :
             CURLINFO_SSL_DATA_IN, (char *)buf, len, NULL);
  (void) ssl;
}